

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O3

void __thiscall
SolverTest_IntOptionHelper_Test::~SolverTest_IntOptionHelper_Test
          (SolverTest_IntOptionHelper_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SolverTest, IntOptionHelper) {
  fmt::MemoryWriter w;
  OptionHelper<int>::Write(w, 42);
  EXPECT_EQ("42", w.str());
  const char *start = "123 ";
  const char *s = start;
  EXPECT_EQ(123, OptionHelper<int>::Parse(s));
  EXPECT_EQ(start + 3, s);
  EXPECT_EQ(42, OptionHelper<int>::CastArg(42));
}